

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

Status __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ParseTypeUrl
          (DescriptorPoolTypeResolver *this,string_view type_url,string *type_name)

{
  string_view pc;
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  char *in_R8;
  AlphaNum *in_R9;
  string_view expected;
  string_view expected_00;
  string_view message;
  allocator<char> local_199;
  string local_198 [48];
  char *local_168;
  string *psStack_160;
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  string local_90;
  undefined1 local_70 [16];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  string_view stripped;
  string *type_name_local;
  DescriptorPoolTypeResolver *this_local;
  string_view type_url_local;
  
  pcVar3 = type_url._M_str;
  psVar2 = type_name;
  local_40 = (undefined1  [8])pcVar3;
  stripped._M_len = (size_t)type_name;
  stripped._M_str = in_R8;
  local_50 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)(type_url._M_len + 8));
  expected._M_len = local_50._8_8_;
  expected._M_str = (char *)psVar2;
  bVar1 = absl::lts_20250127::ConsumePrefix((lts_20250127 *)local_40,local_50._0_8_,expected);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"/");
    expected_00._M_str = (char *)psVar2;
    expected_00._M_len = (size_t)local_60._M_str;
    bVar1 = absl::lts_20250127::ConsumePrefix
                      ((lts_20250127 *)local_40,(Nonnull<absl::string_view_*>)local_60._M_len,
                       expected_00);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_198,(basic_string_view<char,_std::char_traits<char>_> *)local_40,&local_199);
      std::__cxx11::string::operator=((string *)stripped._M_str,local_198);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
      absl::lts_20250127::Status::Status((Status *)this);
      return (Status)(uintptr_t)this;
    }
  }
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_c0,"Invalid type URL, type URLs must be of the form \'");
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (type_url._M_len + 8));
  absl::lts_20250127::AlphaNum::AlphaNum(&local_120,"/<typename>\', got: ");
  pc._M_str = (char *)type_name;
  pc._M_len = (size_t)pcVar3;
  local_168 = pcVar3;
  psStack_160 = type_name;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_150,pc);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_90,(lts_20250127 *)&local_c0,&local_f0,&local_120,&local_150,in_R9);
  local_70 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
  message._M_str = local_70._0_8_;
  message._M_len = (size_t)this;
  absl::lts_20250127::InvalidArgumentError(message);
  std::__cxx11::string::~string((string *)&local_90);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseTypeUrl(absl::string_view type_url,
                            std::string* type_name) {
    absl::string_view stripped = type_url;
    if (!absl::ConsumePrefix(&stripped, url_prefix_) ||
        !absl::ConsumePrefix(&stripped, "/")) {
      return absl::InvalidArgumentError(
          absl::StrCat("Invalid type URL, type URLs must be of the form '",
                       url_prefix_, "/<typename>', got: ", type_url));
    }
    *type_name = std::string(stripped);
    return absl::Status();
  }